

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeIf(InstructionCreater *this,Node *node,Element *refelt)

{
  InstructionList *this_00;
  pointer pEVar1;
  undefined8 uVar2;
  InstructionData *instdata;
  pointer ppJVar3;
  ulong uVar4;
  size_t id;
  long lVar5;
  long lVar6;
  Jump *jinst;
  vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_> recordJ;
  Jump *local_38;
  
  uVar4 = (ulong)((long)(node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
                        .
                        super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
                        .
                        super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) >> 1;
  recordJ.
  super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  recordJ.
  super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  recordJ.
  super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->InstList;
  lVar5 = uVar4 << 4;
  lVar6 = 0x10;
  while (uVar4 = uVar4 - 1, uVar4 != 0) {
    pEVar1 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
             super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
             _M_impl.super__Vector_impl_data._M_start;
    createReferNode(this,(Element *)((long)&pEVar1->field_0 + lVar6));
    instdata = (InstructionData *)operator_new(0x28);
    instdata->_vptr_InstructionData = (_func_int **)0x0;
    *(undefined8 *)&instdata->Inst = 0;
    instdata[1]._vptr_InstructionData = (_func_int **)0x0;
    *(undefined8 *)&instdata[1].Inst = 0;
    instdata[2]._vptr_InstructionData = (_func_int **)0x0;
    instdata->Inst = jmpn;
    instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00161da8;
    *(undefined8 *)&instdata[1].Inst = 0;
    uVar2 = *(undefined8 *)((long)&pEVar1->index + lVar6);
    *(undefined4 *)&instdata[1]._vptr_InstructionData =
         *(undefined4 *)((long)&pEVar1->field_0 + lVar6);
    *(undefined8 *)&instdata[1].Inst = uVar2;
    Instruction::InstructionList::push(this_00,instdata);
    createReferNode(this,(Element *)((long)&pEVar1->field_0 + lVar5));
    jinst = (Jump *)operator_new(0x18);
    jinst->Index = 0;
    (jinst->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
    _vptr_InstructionData = (_func_int **)0x0;
    *(undefined8 *)
     &(jinst->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst = 0;
    (jinst->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst = jump
    ;
    (jinst->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
    _vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00161d60;
    std::vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>::
    push_back(&recordJ,&jinst);
    local_38 = jinst;
    std::
    vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>::
    emplace_back<ICM::Instruction::InstructionData*>
              ((vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
                *)this_00,(InstructionData **)&local_38);
    instdata[2]._vptr_InstructionData =
         (_func_int **)
         ((long)(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->InstList).
                super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                .
                super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
    lVar5 = lVar5 + 0x10;
    lVar6 = lVar6 + 0x10;
  }
  createReferNode(this,(node->
                       super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
                       super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
  Instruction::InstructionList::push(this_00,sing);
  id = ((long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->InstList).
              super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              .
              super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  for (ppJVar3 = recordJ.
                 super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppJVar3 !=
      recordJ.
      super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppJVar3 = ppJVar3 + 1) {
    (*ppJVar3)->Index = id;
  }
  ASTBase::Element::setRefer(refelt,id);
  std::
  _Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>::
  ~_Vector_base(&recordJ.
                 super__Vector_base<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_>
               );
  return true;
}

Assistant:

bool createNodeIf(Node &node, Element &refelt) {
				size_t count = node.size() / 2 - 1;
				vector<Insts::Jump*> recordJ;
				for (size_t i : range(1, 1 + count)) {
					Element &be = node[i];
					Element &de = node[i + count];

					createReferNode(be);
					auto *inst = new Insts::JumpNot();
					inst->Data = ConvertToInstElement(be);
					InstList.push(inst);
					createReferNode(de);
					auto *jinst = new Insts::Jump();
					recordJ.push_back(jinst);
					InstList.push_back(jinst);
					inst->Index = NextInstID();
				}
				createReferNode(node.back());
				InstList.push(sing);
				size_t index = CurrInstID();
				for (auto *p : recordJ) {
					p->Index = index;
				}
				refelt.setRefer(index);
				return true;
			}